

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getSizeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CaseDef_conflict1 *caseDef)

{
  int iVar1;
  ostream *poVar2;
  ostringstream local_190 [8];
  ostringstream str;
  CaseDef_conflict1 *caseDef_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(this + 4));
  std::ostream::operator<<(local_190,iVar1);
  iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(this + 4));
  if (1 < iVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"x");
    iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(this + 4));
    std::ostream::operator<<(poVar2,iVar1);
  }
  iVar1 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(this + 4));
  if (1 < iVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"x");
    iVar1 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(this + 4));
    std::ostream::operator<<(poVar2,iVar1);
  }
  poVar2 = std::operator<<((ostream *)local_190,"_");
  iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(this + 0x10));
  std::ostream::operator<<(poVar2,iVar1);
  iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(this + 0x10));
  if (1 < iVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"x");
    iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(this + 0x10));
    std::ostream::operator<<(poVar2,iVar1);
  }
  iVar1 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(this + 0x10));
  if (1 < iVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"x");
    iVar1 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(this + 0x10));
    std::ostream::operator<<(poVar2,iVar1);
  }
  if (1 < *(uint *)(this + 0x1c)) {
    poVar2 = std::operator<<((ostream *)local_190,"_");
    std::ostream::operator<<(poVar2,*(uint *)(this + 0x1c));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getSizeString (const CaseDef& caseDef)
{
	std::ostringstream	str;

										str << caseDef.renderSize.x();
	if (caseDef.renderSize.y() > 1)		str << "x" << caseDef.renderSize.y();
	if (caseDef.renderSize.z() > 1)		str << "x" << caseDef.renderSize.z();

										str << "_" << caseDef.attachmentSize.x();

	if (caseDef.attachmentSize.y() > 1)	str << "x" << caseDef.attachmentSize.y();
	if (caseDef.attachmentSize.z() > 1)	str << "x" << caseDef.attachmentSize.z();
	if (caseDef.numLayers > 1)			str << "_" << caseDef.numLayers;

	return str.str();
}